

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_funcs.c
# Opt level: O3

PFN_vkVoidFunction ktxLoadVulkanFunction(char *pName)

{
  ktx_error_code_e kVar1;
  PFN_vkVoidFunction p_Var2;
  
  kVar1 = ktxLoadVulkanLibrary();
  if (kVar1 == KTX_SUCCESS) {
    p_Var2 = (PFN_vkVoidFunction)dlsym(ktxVulkanModuleHandle,pName);
    if (p_Var2 == (PFN_vkVoidFunction)0x0) {
      p_Var2 = (PFN_vkVoidFunction)0x0;
      fprintf(_stderr,"Couldn\'t load Vulkan command: %s\n",pName);
    }
  }
  else {
    p_Var2 = (PFN_vkVoidFunction)0x0;
  }
  return p_Var2;
}

Assistant:

PFN_vkVoidFunction
ktxLoadVulkanFunction(const char* pName) {
    ktx_error_code_e rc = ktxLoadVulkanLibrary();
    if (rc != KTX_SUCCESS) {
        return NULL;
    }

    PFN_vkVoidFunction pfn
           = (PFN_vkVoidFunction)LoadProcAddr(ktxVulkanModuleHandle, pName);
    if (pfn == NULL) {
        fprintf(stderr, "Couldn't load Vulkan command: %s\n", pName);
        return NULL;
    }
    return pfn;
}